

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

void __thiscall
poplar::compact_bonsai_nlm<int,_16UL>::show_stats
          (compact_bonsai_nlm<int,_16UL> *this,ostream *os,int n)

{
  ostream *os_00;
  compact_bonsai_nlm<int,_16UL> *in_RSI;
  compact_bonsai_nlm<int,_16UL> *in_RDI;
  string indent;
  char (*in_stack_ffffffffffffff58) [19];
  char *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  compact_bonsai_nlm<int,_16UL> *indent_00;
  ostream *in_stack_ffffffffffffff70;
  string local_38 [40];
  compact_bonsai_nlm<int,_16UL> *local_10;
  
  local_10 = in_RSI;
  get_indent_abi_cxx11_((int)((ulong)in_RDI >> 0x20));
  show_stat<char[19]>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff58);
  size(in_RDI);
  show_stat<unsigned_long>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (unsigned_long *)in_stack_ffffffffffffff58);
  indent_00 = local_10;
  os_00 = (ostream *)num_ptrs((compact_bonsai_nlm<int,_16UL> *)0x141c4f);
  show_stat<unsigned_long>
            (os_00,(string *)indent_00,in_stack_ffffffffffffff60,
             (unsigned_long *)in_stack_ffffffffffffff58);
  alloc_bytes(local_10);
  show_stat<unsigned_long>
            (os_00,(string *)indent_00,(char *)local_10,(unsigned_long *)in_stack_ffffffffffffff58);
  show_stat<unsigned_long>
            (os_00,(string *)indent_00,(char *)local_10,(unsigned_long *)in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_bonsai_nlm");
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "num_ptrs", num_ptrs());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "max_length", max_length_);
        show_stat(os, indent, "ave_length", double(sum_length_) / size());
#endif
        show_stat(os, indent, "chunk_size", ChunkSize);
    }